

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  longlong lVar5;
  ulong uVar6;
  long lVar7;
  Cluster *pCVar8;
  int iVar9;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong unaff_R13;
  long lVar14;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  ulong local_80;
  long local_78;
  long local_70;
  Cues *local_68;
  longlong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  longlong local_38;
  int iVar10;
  
  if (this->m_pos < 0) {
    lVar14 = DoLoadClusterUnknownSize(this,pos,len);
    return lVar14;
  }
  iVar3 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_58,&local_70);
  if (iVar3 < 0) {
    return (long)iVar3;
  }
  if ((-1 < local_58) && (local_58 < local_70)) {
    return -2;
  }
  lVar14 = this->m_start + this->m_size;
  local_80 = 0xffffffffffffffff;
  if (this->m_size < 0) {
    lVar14 = -1;
  }
  local_78 = -1;
  do {
    lVar7 = this->m_pos;
    if (-1 < local_58 && local_58 <= lVar7) {
      return 1;
    }
    if (-1 < lVar14 && lVar14 <= lVar7) {
      return 1;
    }
    *pos = lVar7;
    if (local_70 <= lVar7) {
      *len = 1;
      return -3;
    }
    uVar4 = GetUIntLength(this->m_pReader,lVar7,len);
    iVar10 = 1;
    iVar9 = 1;
    iVar3 = iVar10;
    if ((long)uVar4 < 0) goto LAB_00155b5b;
    if (uVar4 == 0) {
      if ((lVar14 < 0) || (*len + *pos <= lVar14)) {
        lVar7 = *pos;
        if (local_70 < *len + lVar7) goto LAB_0015594f;
        local_48 = lVar7;
        lVar5 = ReadID(this->m_pReader,lVar7,len);
        if (lVar5 < 0) goto LAB_001559cf;
        lVar7 = *pos + *len;
        *pos = lVar7;
        if (local_70 <= lVar7) {
          *len = 1;
          goto LAB_0015594f;
        }
        local_60 = lVar5;
        uVar4 = GetUIntLength(this->m_pReader,lVar7,len);
        if ((long)uVar4 < 0) goto LAB_00155b5b;
        if (uVar4 != 0) goto LAB_0015594f;
        if ((-1 < lVar14) && (lVar14 < *len + *pos)) goto LAB_001559cf;
        if (local_70 < *len + *pos) goto LAB_0015594f;
        uVar11 = ReadUInt(this->m_pReader,*pos,len);
        uVar4 = uVar11;
        iVar3 = iVar9;
        if (-1 < (long)uVar11) {
          lVar7 = *len;
          lVar12 = *pos + lVar7;
          *pos = lVar12;
          uVar4 = unaff_R13;
          if (uVar11 != 0) {
            uVar6 = -1L << ((char)lVar7 * '\a' & 0x3fU) ^ uVar11;
            if (((lVar14 < 0) || (uVar6 == 0xffffffffffffffff)) ||
               ((long)(lVar12 + uVar11) <= lVar14)) {
              if (local_60 == 0x1f43b675) {
                local_78 = local_48 - this->m_start;
                if (uVar6 != 0xffffffffffffffff) {
                  local_80 = uVar11;
                }
                iVar3 = 2;
                goto LAB_00155b5b;
              }
              if (local_60 == 0x1c53bb6b) {
                if (uVar6 != 0xffffffffffffffff) {
                  local_60 = lVar12;
                  if (this->m_pCues == (Cues *)0x0) {
                    local_50 = uVar11;
                    local_68 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                    if (local_68 == (Cues *)0x0) {
                      local_68 = (Cues *)0x0;
                    }
                    else {
                      Cues::Cues(local_68,this,local_60,local_50,local_48,
                                 (local_50 - local_48) + local_60);
                    }
                    this->m_pCues = local_68;
                    unaff_R13 = -(ulong)(local_68 == (Cues *)0x0) | unaff_R13;
                    uVar11 = local_50;
                    uVar4 = unaff_R13;
                    iVar3 = iVar10;
                    if (local_68 == (Cues *)0x0) goto LAB_00155b5b;
                  }
                  this->m_pos = *pos + uVar11;
                  uVar4 = unaff_R13;
                  iVar3 = 3;
                  goto LAB_00155b5b;
                }
              }
              else if (uVar6 != 0xffffffffffffffff) {
                this->m_pos = lVar12 + uVar11;
                goto LAB_00155a90;
              }
            }
            goto LAB_001559cf;
          }
          this->m_pos = lVar12;
LAB_00155a90:
          iVar3 = 3;
        }
      }
      else {
LAB_001559cf:
        uVar4 = 0xfffffffffffffffe;
        iVar3 = iVar9;
      }
    }
    else {
LAB_0015594f:
      uVar4 = 0xfffffffffffffffd;
      iVar3 = iVar9;
    }
LAB_00155b5b:
    unaff_R13 = uVar4;
  } while (iVar3 == 3);
  if (iVar3 != 2) {
    return uVar4;
  }
  if (local_78 < 0) {
    return -2;
  }
  lVar7 = Cluster::HasBlockEntries(this,local_78,&local_38,&local_40);
  if (lVar7 < 0) {
    *pos = local_38;
    *len = local_40;
    return lVar7;
  }
  lVar12 = this->m_clusterCount;
  lVar1 = this->m_clusterPreloadCount;
  if (lVar1 < 1) goto LAB_00155bed;
  uVar11 = 0xfffffffffffffffe;
  if (this->m_clusterSize <= lVar12) {
    return -2;
  }
  pCVar8 = this->m_clusters[lVar12];
  if ((pCVar8 == (Cluster *)0x0) || (-1 < pCVar8->m_index)) {
LAB_00155be2:
    bVar2 = false;
    uVar4 = uVar11;
  }
  else {
    lVar13 = pCVar8->m_element_start - pCVar8->m_pSegment->m_start;
    if (lVar13 < 0) goto LAB_00155be2;
    bVar2 = true;
    if (lVar13 == local_78) {
      if (lVar7 != 0) {
        if ((long)local_80 < 0) {
          if (pCVar8->m_element_size < 1) {
            uVar4 = 0xfffffffffffffffe;
            bVar2 = false;
            goto LAB_00155be4;
          }
          *pos = pCVar8->m_element_start + pCVar8->m_element_size;
        }
        else {
          *pos = *pos + local_80;
        }
        pCVar8->m_index = lVar12;
        this->m_clusterCount = lVar12 + 1;
        this->m_clusterPreloadCount = lVar1 + -1;
        lVar1 = *pos;
        this->m_pos = lVar1;
        uVar11 = (ulong)(lVar1 <= lVar14 || lVar14 < 0) * 2 - 2;
      }
      goto LAB_00155be2;
    }
  }
LAB_00155be4:
  if (!bVar2) {
    return uVar4;
  }
LAB_00155bed:
  if (lVar7 == 0) {
    if (-1 < (long)local_80) {
      *pos = *pos + local_80;
    }
    lVar7 = *pos;
    if (lVar7 < local_58 || local_58 < 0) {
      if (lVar7 < lVar14 || lVar14 < 0) {
        this->m_pos = lVar7;
        return 2;
      }
      this->m_pos = lVar14;
    }
    else {
      this->m_pos = local_58;
    }
    lVar7 = 1;
  }
  else {
    pCVar8 = Cluster::Create(this,lVar12,local_78);
    lVar7 = -1;
    if (pCVar8 != (Cluster *)0x0) {
      bVar2 = AppendCluster(this,pCVar8);
      if (bVar2) {
        if ((long)local_80 < 0) {
          this->m_pUnknownSize = pCVar8;
          lVar7 = 0;
          this->m_pos = -*pos;
        }
        else {
          lVar7 = local_80 + *pos;
          *pos = lVar7;
          this->m_pos = lVar7;
          lVar7 = (ulong)(lVar7 <= lVar14 || lVar14 < 1) * 2 + -2;
        }
      }
      else {
        Cluster::~Cluster(pCVar8);
        operator_delete(pCVar8);
      }
    }
  }
  return lVar7;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (!AppendCluster(pCluster)) {
    delete pCluster;
    return -1;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}